

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grisu3_print.h
# Opt level: O1

int grisu3_print_double(double v,char *dst)

{
  uint uVar1;
  byte bVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  char *buffer;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  uint64_t ulp;
  uint uVar16;
  uint uVar17;
  uint64_t d;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  uint64_t ten_kappa;
  ulong uVar21;
  uint64_t wp_W;
  uint val;
  int iVar22;
  double dVar23;
  ulong uVar24;
  bool bVar25;
  undefined8 in_XMM0_Qb;
  undefined1 auVar26 [16];
  grisu3_diy_fp_t gVar27;
  grisu3_diy_fp_t gVar28;
  
  auVar26._8_8_ = in_XMM0_Qb;
  auVar26._0_8_ = v;
  if (dst == (char *)0x0) {
    __assert_fail("dst",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/include/flatcc/portable/grisu3_print.h"
                  ,0xd0,"int grisu3_print_double(double, char *)");
  }
  if (0xffe0000000000000 < (ulong)((long)v * 2)) {
    builtin_strncpy(dst,"NaN(",4);
    dst[0x14] = ')';
    dst[0x15] = '\0';
    lVar12 = 0x13;
    do {
      dst[lVar12] = grisu3_print_nan_hexdigits[SUB84(v,0) & 0xf];
      v = (double)((ulong)v >> 4);
      lVar12 = lVar12 + -1;
    } while (lVar12 != 3);
    return 0x15;
  }
  buffer = dst;
  if ((long)v < 0) {
    *dst = '-';
    auVar26 = auVar26 ^ _DAT_00133c40;
    v = ABS(v);
    buffer = dst + 1;
  }
  iVar9 = (int)buffer;
  iVar5 = (int)dst;
  if (v == INFINITY) {
    builtin_strncpy(buffer,"inf",4);
    return (iVar9 - iVar5) + 3;
  }
  if (v == 0.0) {
    buffer[0] = '0';
    buffer[1] = '\0';
    return (iVar9 - iVar5) + 1;
  }
  dVar23 = auVar26._0_8_;
  bVar25 = (auVar26 & (undefined1  [16])0x7ff0000000000000) == (undefined1  [16])0x0;
  uVar24 = ((ulong)dVar23 & 0xfffffffffffff) + 0x10000000000000;
  if (bVar25) {
    uVar24 = (ulong)dVar23 & 0xfffffffffffff;
  }
  iVar11 = -0x432;
  if (!bVar25) {
    iVar11 = ((auVar26._4_4_ & 0x7ff00000) >> 0x14) - 0x433;
  }
  gVar27.e = iVar11;
  gVar27.f = uVar24;
  gVar27._12_4_ = 0;
  gVar27 = grisu3_diy_fp_normalize(gVar27);
  iVar22 = gVar27.e;
  gVar28.e = iVar11 + -1;
  gVar28.f = uVar24 * 2 + 1;
  gVar28._12_4_ = 0;
  gVar28 = grisu3_diy_fp_normalize(gVar28);
  if ((dVar23 <= 0.0) || (1.79769313486232e+308 < dVar23)) {
    __assert_fail("v > 0 && v <= 1.7976931348623157e308",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/include/flatcc/portable/grisu3_print.h"
                  ,0x8a,"int grisu3(double, char *, int *, int *)");
  }
  iVar10 = iVar11 + -2;
  lVar12 = uVar24 << 2;
  if ((auVar26 & (undefined1  [16])0xfffffffffffff) != (undefined1  [16])0x0 ||
      (auVar26 & (undefined1  [16])0x7ff0000000000000) == (undefined1  [16])0x0) {
    iVar10 = iVar11 + -1;
    lVar12 = uVar24 * 2;
  }
  uVar24 = lVar12 + -1 << ((char)iVar10 - (char)gVar28.e & 0x3fU);
  dVar23 = (double)(-0x3d - iVar22) * 0.30102999566398114;
  iVar10 = (int)dVar23 + (uint)(0.0 <= dVar23 && (double)(int)dVar23 != dVar23);
  iVar11 = iVar10 + 0x15b;
  iVar10 = iVar10 + 0x162;
  if (-1 < iVar11) {
    iVar10 = iVar11;
  }
  lVar12 = (long)(iVar10 >> 3);
  uVar7 = grisu3_diy_fp_pow_cache[lVar12 + 1].fract & 0xffffffff;
  uVar18 = grisu3_diy_fp_pow_cache[lVar12 + 1].fract >> 0x20;
  uVar19 = uVar24 >> 0x20;
  uVar24 = uVar24 & 0xffffffff;
  uVar21 = uVar18 * uVar24;
  uVar20 = uVar19 * uVar7;
  uVar14 = gVar28.f >> 0x20;
  uVar6 = uVar18 * (uint)gVar28.f;
  uVar15 = uVar14 * uVar7;
  uVar19 = (((uVar21 & 0xffffffff) + (uVar20 & 0xffffffff) + (uVar24 * uVar7 >> 0x20) + 0x80000000
            >> 0x20) + (uVar21 >> 0x20) + (uVar20 >> 0x20) + uVar18 * uVar19) - 1;
  uVar6 = ((uVar6 & 0xffffffff) + (uVar15 & 0xffffffff) + ((uint)gVar28.f * uVar7 >> 0x20) +
           0x80000000 >> 0x20) + (uVar6 >> 0x20) + (uVar15 >> 0x20) + uVar18 * uVar14 + 1;
  uVar24 = uVar6 - uVar19;
  if (uVar6 < uVar19) {
LAB_00125900:
    __assert_fail("x.e == y.e && x.f >= y.f",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/include/flatcc/portable/grisu3_math.h"
                  ,0xf8,"grisu3_diy_fp_t grisu3_diy_fp_minus(grisu3_diy_fp_t, grisu3_diy_fp_t)");
  }
  iVar11 = (int)grisu3_diy_fp_pow_cache[lVar12 + 1].d_exp;
  iVar10 = grisu3_diy_fp_pow_cache[lVar12 + 1].b_exp + iVar22;
  uVar14 = gVar27.f >> 0x20;
  uVar20 = uVar7 * uVar14;
  uVar21 = gVar27.f & 0xffffffff;
  uVar19 = uVar18 * uVar21;
  cVar3 = (char)iVar10;
  bVar2 = -cVar3 - 0x40;
  bVar8 = -cVar3;
  ten_kappa = 1L << (bVar8 & 0x3f);
  uVar15 = uVar6 >> (bVar8 & 0x3f);
  uVar7 = ((uVar19 & 0xffffffff) + (uVar7 * uVar21 >> 0x20) + (uVar20 & 0xffffffff) + 0x80000000 >>
          0x20) + (uVar19 >> 0x20) + uVar14 * uVar18 + (uVar20 >> 0x20);
  uVar14 = ten_kappa - 1;
  uVar18 = uVar14 & uVar6;
  uVar16 = iVar10 * 0x4d1 + 0x26d51 >> 0xc;
  uVar17 = uVar16 + 1;
  if (grisu3_pow10_cache[(long)(int)uVar16 + 1] <= (uint)uVar15) {
    uVar16 = uVar17;
  }
  uVar19 = (ulong)grisu3_pow10_cache[(int)uVar16];
  wp_W = uVar6 - uVar7;
  bVar25 = uVar6 < uVar7 || gVar28.e != iVar22;
  uVar4 = (int)uVar16 >> 0x1f & uVar16;
  uVar6 = 0;
  do {
    if (uVar16 - uVar4 == uVar6) {
      ulp = 1;
      goto LAB_0012567a;
    }
    uVar7 = uVar15 & 0xffffffff;
    uVar15 = uVar7 % uVar19;
    buffer[uVar6] = (char)(uVar7 / uVar19) + '0';
    uVar7 = (uVar15 << (bVar2 & 0x3f)) + uVar18;
    if (uVar7 < uVar24) {
      if (bVar25) goto LAB_00125900;
      uVar17 = grisu3_round_weed(buffer,(int)uVar6 + 1,wp_W,uVar24,uVar7,uVar19 << (bVar2 & 0x3f),1)
      ;
    }
    else {
      uVar19 = uVar19 / 10;
    }
    uVar6 = uVar6 + 1;
  } while (uVar24 <= uVar7);
  uVar4 = uVar16 - (int)uVar6;
LAB_001256f1:
  uVar16 = (uint)uVar6;
  if (uVar17 == 0) {
    iVar11 = sprintf(buffer,"%.17g");
    iVar5 = (iVar9 - iVar5) + iVar11;
  }
  else {
    val = uVar4 - iVar11;
    uVar13 = -val;
    uVar17 = 1;
    if (2 < (int)uVar16) {
      uVar17 = uVar16 - 1;
    }
    uVar1 = uVar13;
    if (SBORROW4(uVar17,uVar13) != (int)(uVar17 + val) < 0) {
      uVar1 = uVar17;
    }
    if (((int)val < 0) &&
       ((uVar16 == uVar13 || SBORROW4(uVar16,uVar13) != (int)(uVar16 + val) < 0) &&
        -3 < (int)(val + uVar16))) {
      memmove(buffer + (-(long)(int)uVar16 - (long)(int)val) + 2,buffer,(long)(int)uVar16);
      buffer[0] = '0';
      buffer[1] = '.';
      uVar24 = 2;
      uVar17 = 2 - (val + uVar16);
      if (2 < (int)uVar17) {
        memset(buffer + 2,0x30,(ulong)((~uVar4 + iVar11) - uVar16) + 1);
        uVar24 = 2;
        do {
          uVar24 = uVar24 + 1;
        } while (uVar24 < uVar17);
      }
      uVar16 = (int)uVar24 + uVar16;
    }
    else if ((int)uVar16 < 2 || -1 < (int)val) {
      if (val < 3) {
        if (val != 0) {
          uVar17 = 1;
          if ((int)val < 1) {
            uVar17 = val;
          }
          memset(buffer + (int)uVar16,0x30,(ulong)((uVar4 - uVar17) - iVar11) + 1);
          iVar22 = val + 1;
          uVar16 = (((uVar16 + uVar4) - uVar17) - iVar11) + 1;
          do {
            iVar22 = iVar22 + -1;
          } while (1 < iVar22);
        }
      }
      else {
        buffer[(int)uVar16] = 'e';
        iVar11 = grisu3_i_to_str(val,buffer + (long)(int)uVar16 + 1);
        uVar16 = uVar16 + iVar11 + 1;
      }
    }
    else {
      if (0 < (int)uVar17) {
        uVar24 = 1;
        if (1 < (int)uVar1) {
          uVar24 = (ulong)uVar1;
        }
        lVar12 = 0;
        do {
          buffer[lVar12 + (ulong)(uVar16 & 0x7fffffff)] =
               buffer[lVar12 + ((ulong)(uVar16 & 0x7fffffff) - 1)];
          lVar12 = lVar12 + -1;
        } while (-lVar12 != uVar24);
      }
      lVar12 = (uVar6 & 0xffffffff) + 1;
      buffer[(int)(uVar16 - uVar1)] = '.';
      if (val + uVar1 == 0) {
        uVar16 = (uint)lVar12;
      }
      else {
        buffer[lVar12] = 'e';
        iVar11 = grisu3_i_to_str(val + uVar1,buffer + (uVar6 & 0xffffffff) + 2);
        uVar16 = uVar16 + iVar11 + 2;
      }
    }
    buffer[(int)uVar16] = '\0';
    iVar5 = (iVar9 + uVar16) - iVar5;
  }
  return iVar5;
LAB_0012567a:
  do {
    ulp = ulp * 10;
    uVar24 = uVar24 * 10;
    buffer[uVar6] = (char)(uVar18 * 10 >> (bVar2 & 0x3f)) + '0';
    uVar18 = uVar18 * 10 & uVar14;
    if (uVar18 < uVar24) {
      if (bVar25) goto LAB_00125900;
      uVar17 = grisu3_round_weed(buffer,(int)uVar6 + 1,ulp * wp_W,uVar24,uVar18,ten_kappa,ulp);
    }
    uVar6 = uVar6 + 1;
    uVar4 = uVar4 - 1;
  } while (uVar24 <= uVar18);
  goto LAB_001256f1;
}

Assistant:

static int grisu3_print_double(double v, char *dst)
{
    int d_exp, len, success, decimals, i;
    uint64_t u64 = grisu3_cast_uint64_from_double(v);
    char *s2 = dst;
    assert(dst);

    /* Prehandle NaNs */
    if ((u64 << 1) > 0xFFE0000000000000ULL) return grisu3_print_nan(u64, dst);
    /* Prehandle negative values. */
    if ((u64 & GRISU3_D64_SIGN) != 0) { *s2++ = '-'; v = -v; u64 ^= GRISU3_D64_SIGN; }
    /* Prehandle zero. */
    if (!u64) { *s2++ = '0'; *s2 = '\0'; return (int)(s2 - dst); }
    /* Prehandle infinity. */
    if (u64 == GRISU3_D64_EXP_MASK) { *s2++ = 'i'; *s2++ = 'n'; *s2++ = 'f'; *s2 = '\0'; return (int)(s2 - dst); }

    success = grisu3(v, s2, &len, &d_exp);
    /* If grisu3 was not able to convert the number to a string, then use old sprintf (suboptimal). */
    if (!success) return sprintf(s2, "%.17g", v) + (int)(s2 - dst);

    /* We now have an integer string of form "151324135" and a base-10 exponent for that number. */
    /* Next, decide the best presentation for that string by whether to use a decimal point, or the scientific exponent notation 'e'. */
    /* We don't pick the absolute shortest representation, but pick a balance between readability and shortness, e.g. */
    /* 1.545056189557677e-308 could be represented in a shorter form */
    /* 1545056189557677e-323 but that would be somewhat unreadable. */
    decimals = GRISU3_MIN(-d_exp, GRISU3_MAX(1, len-1));

    /* mikkelfj:
     * fix zero prefix .1 => 0.1, important for JSON export.
     * prefer unscientific notation at same length:
     * -1.2345e-4 over -1.00012345,
     * -1.0012345 over -1.2345e-3
     */
    if (d_exp < 0 && (len + d_exp) > -3 && len <= -d_exp)
    {
        /* mikkelfj: fix zero prefix .1 => 0.1, and short exponents 1.3e-2 => 0.013. */
        memmove(s2 + 2 - d_exp - len, s2, (size_t)len);
        s2[0] = '0';
        s2[1] = '.';
        for (i = 2; i < 2-d_exp-len; ++i) s2[i] = '0';
        len += i;
    }
    else if (d_exp < 0 && len > 1) /* Add decimal point? */
    {
        for(i = 0; i < decimals; ++i) s2[len-i] = s2[len-i-1];
        s2[len++ - decimals] = '.';
        d_exp += decimals;
        /* Need scientific notation as well? */
        if (d_exp != 0) { s2[len++] = 'e'; len += grisu3_i_to_str(d_exp, s2+len); }
    }
    /* Add scientific notation? */
    else if (d_exp < 0 || d_exp > 2) { s2[len++] = 'e'; len += grisu3_i_to_str(d_exp, s2+len); }
    /* Add zeroes instead of scientific notation? */
    else if (d_exp > 0) { while(d_exp-- > 0) s2[len++] = '0'; }
    s2[len] = '\0'; /* grisu3 doesn't null terminate, so ensure termination. */
    return (int)(s2+len-dst);
}